

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_inlets.h
# Opt level: O0

void * proxy_new(void *x,long id,long *stuffloc)

{
  size_type sVar1;
  reference this;
  undefined1 local_68 [8];
  t_mock_inlet inlet;
  t_mock_inlets *mock_inlets;
  object_inlets *inlets;
  t_object *o;
  long *stuffloc_local;
  long id_local;
  void *x_local;
  
  inlet.m_stuffloc = *(long **)((long)x + 0x10);
  c74::max::t_mock_inlet::t_mock_inlet((t_mock_inlet *)local_68,x,id,stuffloc);
  sVar1 = std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::size
                    ((vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_> *)
                     inlet.m_stuffloc);
  if (sVar1 < id + 1U) {
    std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::resize
              ((vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_> *)
               inlet.m_stuffloc,id + 1);
  }
  this = std::vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_>::operator[]
                   ((vector<c74::max::t_mock_inlet,_std::allocator<c74::max::t_mock_inlet>_> *)
                    inlet.m_stuffloc,id);
  c74::max::t_mock_inlet::operator=(this,(t_mock_inlet *)local_68);
  c74::max::t_mock_inlet::~t_mock_inlet((t_mock_inlet *)local_68);
  return (void *)0x0;
}

Assistant:

MOCK_EXPORT void *proxy_new(void *x, long id, long *stuffloc)
{
    t_object		*o = (t_object*)x;
    object_inlets	*inlets = (object_inlets*)o->o_inlet;
    t_mock_inlets&	mock_inlets = inlets->mock_inlets;

    t_mock_inlet inlet(x, id, stuffloc);

    if (id+1 > mock_inlets.size())
        mock_inlets.resize(id+1);
    mock_inlets[id] = inlet;
    return NULL;
}